

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

int __thiscall glslang::TScanContext::secondGenerationImage(TScanContext *this)

{
  int iVar1;
  TParseContextBase *pTVar2;
  
  pTVar2 = this->parseContext;
  if ((pTVar2->super_TParseVersions).profile == EEsProfile) {
    if ((pTVar2->super_TParseVersions).version < 0x136) {
      if (3 < (int)((ulong)((long)(pTVar2->symbolTable->table).
                                  super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar2->symbolTable->table).
                                 super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
LAB_004c4ece:
        if ((pTVar2->super_TParseVersions).forwardCompatible == true) {
          (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[0x2e])
                    (pTVar2,&this->loc,"using future type keyword",this->tokenText,"");
        }
        iVar1 = identifierOrType(this);
        return iVar1;
      }
    }
    else {
      reservedWord(this);
    }
  }
  else if ((3 < (int)((ulong)((long)(pTVar2->symbolTable->table).
                                    super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar2->symbolTable->table).
                                   super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
          ((pTVar2->super_TParseVersions).version < 0x1a4)) {
    iVar1 = (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[8])
                      (pTVar2,"GL_ARB_shader_image_load_store");
    if ((char)iVar1 == '\0') {
      pTVar2 = this->parseContext;
      goto LAB_004c4ece;
    }
  }
  return this->keyword;
}

Assistant:

int TScanContext::secondGenerationImage()
{
    if (parseContext.isEsProfile() && parseContext.version >= 310) {
        reservedWord();
        return keyword;
    }

    if (parseContext.symbolTable.atBuiltInLevel() ||
        (!parseContext.isEsProfile() &&
         (parseContext.version >= 420 || parseContext.extensionTurnedOn(E_GL_ARB_shader_image_load_store))))
        return keyword;

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using future type keyword", tokenText, "");

    return identifierOrType();
}